

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

size_t gl3cts::TextureSwizzle::get_index_of_format(GLenum internal_format)

{
  GLenum GVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  TestError *this;
  GLenum *pGVar5;
  bool bVar6;
  
  if (internal_format == 0) {
    sVar4 = 0;
  }
  else {
    if (_DAT_021da0c4 == internal_format) {
      bVar6 = false;
      sVar4 = 0;
    }
    else {
      uVar2 = 0xffffffffffffffff;
      pGVar5 = (GLenum *)&DAT_021da13c;
      do {
        uVar3 = uVar2;
        if (uVar3 == 0x45) goto LAB_00862294;
        GVar1 = *pGVar5;
        uVar2 = uVar3 + 1;
        pGVar5 = pGVar5 + 0x1e;
      } while (GVar1 != internal_format);
      bVar6 = 0x45 < uVar3 + 1;
      sVar4 = uVar3 + 2;
    }
    if (bVar6) {
LAB_00862294:
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Unknown internal format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0x721);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return sVar4;
}

Assistant:

size_t get_index_of_format(glw::GLenum internal_format)
{
	if (GL_ZERO == internal_format)
	{
		return 0;
	}

	for (size_t i = 0; i < n_texture_formats; ++i)
	{
		if (texture_formats[i].m_internal_format == internal_format)
		{
			return i;
		}
	}

	TCU_FAIL("Unknown internal format");
	return -1;
}